

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::finished(torrent *this)

{
  uint uVar1;
  pointer pppVar2;
  peer_connection *ppVar3;
  pointer pppVar4;
  bool bVar5;
  time_point32 tVar6;
  int iVar7;
  time_t tVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  peer_connection **p_1;
  pointer pppVar9;
  peer_connection *p;
  error_code local_98;
  torrent *local_80;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  seeds;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_58;
  _Function_base local_50;
  
  update_want_tick(this);
  update_state_list(this);
  set_state(this,finished);
  set_queue_position(this,(queue_position_t)0xffffffff);
  tVar6 = time_now32();
  (this->m_became_finished).__d.__r = (rep_conflict)tVar6.__d.__r;
  bVar5 = is_seed(this);
  if (bVar5) {
    completed(this);
  }
  send_upload_only(this);
  state_updated(this);
  if (this->m_completed_time == 0) {
    tVar8 = time((time_t *)0x0);
    this->m_completed_time = tVar8;
  }
  iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  bVar5 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar7),0x800e);
  if (bVar5) {
    seeds.
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    seeds.
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    seeds.
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pppVar2 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pppVar9 = (this->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pppVar4 = seeds.
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pppVar9 != pppVar2;
        pppVar9 = pppVar9 + 1) {
      p = *pppVar9;
      bVar5 = peer_connection::upload_only(p);
      ppVar3 = p;
      if (bVar5) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_98,torrent_finished,(type *)0x0);
        bVar5 = peer_connection::can_disconnect(ppVar3,&local_98);
        if (bVar5) {
          peer_connection::peer_log(p,info,"SEED","CLOSING CONNECTION");
          ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::push_back(&seeds,&p);
        }
      }
    }
    local_80 = this;
    for (pppVar9 = seeds.
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pppVar9 != pppVar4;
        pppVar9 = pppVar9 + 1) {
      ppVar3 = *pppVar9;
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_98,torrent_finished,(type *)0x0);
      (*(ppVar3->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar3,&local_98,1,0);
    }
    ::std::
    _Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ::~_Vector_base(&seeds.
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   );
    this = local_80;
  }
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    update_want_peers(this);
    if ((this->m_storage).m_disk_io != (disk_interface *)0x0) {
      iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[4])();
      uVar1 = (this->m_storage).m_idx.m_val;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_98,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
      seeds.
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)on_cache_flushed;
      seeds.
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      seeds.
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)seeds.
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      _Stack_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.cat_;
      local_98.val_ = 0;
      local_98.failed_ = false;
      local_98._5_3_ = 0;
      local_98.cat_ = (error_category *)0x0;
      ::std::function<void()>::
      function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,bool))(bool)>,void>
                ((function<void()> *)&local_50,
                 (_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_bool))(bool)>
                  *)&seeds);
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x38))
                ((long *)CONCAT44(extraout_var_00,iVar7),uVar1,&local_50);
      ::std::_Function_base::~_Function_base(&local_50);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.cat_);
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
    }
    if ((this->field_0x600 & 1) != 0) {
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
    }
  }
  return;
}

Assistant:

void torrent::finished()
	{
		update_want_tick();
		update_state_list();

		INVARIANT_CHECK;

		TORRENT_ASSERT(is_finished());

		set_state(torrent_status::finished);
		set_queue_position(no_pos);

		m_became_finished = aux::time_now32();

		// we have to call completed() before we start
		// disconnecting peers, since there's an assert
		// to make sure we're cleared the piece picker
		if (is_seed()) completed();

		send_upload_only();
		state_updated();

		if (m_completed_time == 0)
			m_completed_time = time(nullptr);

		// disconnect all seeds
		if (settings().get_bool(settings_pack::close_redundant_connections))
		{
			// TODO: 1 should disconnect all peers that have the pieces we have
			// not just seeds. It would be pretty expensive to check all pieces
			// for all peers though
			std::vector<peer_connection*> seeds;
			for (auto* p : m_connections)
			{
				TORRENT_INCREMENT(m_iterating_connections);
				TORRENT_ASSERT(p->associated_torrent().lock().get() == this);
				if (p->upload_only() && p->can_disconnect(errors::torrent_finished))
				{
#ifndef TORRENT_DISABLE_LOGGING
					p->peer_log(peer_log_alert::info, "SEED", "CLOSING CONNECTION");
#endif
					seeds.push_back(p);
				}
			}
			for (auto& p : seeds)
				p->disconnect(errors::torrent_finished, operation_t::bittorrent
					, peer_connection_interface::normal);
		}

		if (m_abort) return;

		update_want_peers();

		if (m_storage)
		{
			// we need to keep the object alive during this operation
			m_ses.disk_thread().async_release_files(m_storage
				, std::bind(&torrent::on_cache_flushed, shared_from_this(), false));
			m_ses.deferred_submit_jobs();
		}

		// this torrent just completed downloads, which means it will fall
		// under a different limit with the auto-manager. Make sure we
		// update auto-manage torrents in that case
		if (m_auto_managed)
			m_ses.trigger_auto_manage();
	}